

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientFeederApplication.h
# Opt level: O1

void __thiscall
ClientFeederApplication::ClientFeederApplication
          (ClientFeederApplication *this,Logger<std::shared_ptr<spdlog::logger>_> *logger,
          AppConfig *configs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->m_logger).super_ILogger<std::shared_ptr<spdlog::logger>_>._vptr_ILogger =
       (_func_int **)&PTR__ILogger_00138f90;
  (this->m_logger).super_ILogger<std::shared_ptr<spdlog::logger>_>.LOG_MESSAGE_BUFFER_SIZE =
       (logger->super_ILogger<std::shared_ptr<spdlog::logger>_>).LOG_MESSAGE_BUFFER_SIZE;
  (this->m_logger).super_ILogger<std::shared_ptr<spdlog::logger>_>.m_log.
  super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (logger->super_ILogger<std::shared_ptr<spdlog::logger>_>).m_log.
       super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (logger->super_ILogger<std::shared_ptr<spdlog::logger>_>).m_log.
           super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->m_logger).super_ILogger<std::shared_ptr<spdlog::logger>_>.m_log.
  super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_logger).super_ILogger<std::shared_ptr<spdlog::logger>_>._vptr_ILogger =
       (_func_int **)&PTR__Logger_00138f30;
  (this->m_logger).m_logger.
  super___shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (logger->m_logger).
            super___shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  p_Var1 = (logger->m_logger).
           super___shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (this->m_logger).m_logger.
  super___shared_ptr<LogManager::Interfaces::ILogger<std::shared_ptr<spdlog::logger>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_configs).
  super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_IConfigurationMap = (_func_int **)&PTR__IConfigurationMap_00138ef0;
  std::
  _Rb_tree<ConfigManager::Enums::Configurations,_std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<ConfigManager::Enums::Configurations>,_std::allocator<std::pair<const_ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&(this->m_configs).
              super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .m_configs._M_t,
             &(configs->
              super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).m_configs._M_t);
  (this->m_configs).
  super_IConfigurationMap<ConfigManager::Enums::Configurations,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_IConfigurationMap = (_func_int **)&PTR__IConfigurationMap_00138e88;
  (this->m_continue)._M_base._M_i = true;
  return;
}

Assistant:

ClientFeederApplication(LogManager::Logger<std::shared_ptr<spdlog::logger>>& logger,
                            ConfigManager::Configurations::AppConfig& configs) :
        m_logger(logger),
        m_configs(configs),
        m_continue(true)
    {}